

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

bool __thiscall flatbuffers::BinaryAnnotator::ContainsSection(BinaryAnnotator *this,uint64_t offset)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  
  p_Var1 = &(this->sections_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var2 != (_Rb_tree_node_base *)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < offset]) {
    if (*(ulong *)(p_Var2 + 1) >= offset) {
      p_Var5 = p_Var2;
    }
  }
  if (((_Rb_tree_header *)p_Var5 == p_Var1) || (bVar3 = true, *(uint64_t *)(p_Var5 + 1) != offset))
  {
    if ((p_Var5 == (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) ||
       (lVar4 = std::_Rb_tree_decrement(p_Var5), offset < *(ulong *)(lVar4 + 0x20))) {
      bVar3 = false;
    }
    else {
      bVar3 = offset < (ulong)(*(long *)(*(long *)(lVar4 + 0x58) + -0x98) +
                              *(long *)(*(long *)(lVar4 + 0x58) + -0xa0));
    }
  }
  return bVar3;
}

Assistant:

bool BinaryAnnotator::ContainsSection(const uint64_t offset) {
  auto it = sections_.lower_bound(offset);
  // If the section is found, check that it is exactly equal its offset.
  if (it != sections_.end() && it->first == offset) { return true; }

  // If this was the first section, there are no other previous sections to
  // check.
  if (it == sections_.begin()) { return false; }

  // Go back one section.
  --it;

  // And check that if the offset is covered by the section.
  return offset >= it->first && offset < it->second.regions.back().offset +
                                             it->second.regions.back().length;
}